

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O3

bool GenerateFineGeometryCuttingPlane
               (vector3 *start_vertex,vector3 *end_vertex,double half_offset_distance,
               double *param_4,double last_half_offset_distance,double *last_local_layer_height,
               double *cylinder_height,bool has_cutting_plane,CuttingPlane *cutting_plane,
               fstream *out)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  bool bVar5;
  ostream *poVar6;
  bool bVar7;
  undefined3 in_register_00000089;
  ostream *os;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double distance_tolerance;
  double local_1a8;
  double dStack_1a0;
  vector3 local_168;
  double local_148;
  double *local_140;
  double *local_138;
  double local_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  vector3 local_c8;
  vector3 local_a8;
  vector3 local_88;
  vector3 local_68;
  vector3 local_48;
  
  local_130 = 1.5;
  if (CONCAT31(in_register_00000089,has_cutting_plane) == 0) {
    dVar11 = end_vertex->x;
    local_d8 = start_vertex->x;
    bVar7 = false;
  }
  else {
    bVar5 = CuttingPlane::DeviationFromPlane(cutting_plane,start_vertex,end_vertex,&local_130);
    dVar11 = end_vertex->x;
    local_d8 = start_vertex->x;
    bVar7 = true;
    if (bVar5) {
      dVar9 = (cutting_plane->uniform_normal).x;
      dVar1 = (cutting_plane->uniform_normal).y;
      dVar10 = (cutting_plane->uniform_normal).z;
      dVar8 = (start_vertex->z * dVar10 + local_d8 * dVar9 + start_vertex->y * dVar1) -
              cutting_plane->start_distance;
      bVar7 = false;
      if (0.0 < dVar8) {
        return false;
      }
      if (((end_vertex->z * dVar10 + dVar11 * dVar9 + end_vertex->y * dVar1) -
          cutting_plane->start_distance) * dVar8 <= 0.0) {
        return false;
      }
    }
  }
  dVar1 = dVar11 - local_d8;
  dVar10 = end_vertex->y;
  dVar9 = end_vertex->z;
  dStack_d0 = start_vertex->y;
  auVar16._0_8_ = dVar10 - dStack_d0;
  dVar8 = SQRT(auVar16._0_8_ * auVar16._0_8_ + dVar1 * dVar1);
  auVar16._8_8_ = -dVar1;
  auVar17._8_4_ = SUB84(dVar8,0);
  auVar17._0_8_ = dVar8;
  auVar17._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar17 = divpd(auVar16,auVar17);
  local_f8 = auVar17._0_8_ * half_offset_distance;
  dStack_f0 = auVar17._8_8_ * half_offset_distance;
  local_108 = local_d8 + local_f8;
  dStack_100 = dStack_d0 + dStack_f0;
  local_f8 = local_f8 + dVar11;
  dStack_f0 = dStack_f0 + dVar10;
  dVar15 = -auVar17._0_8_ * half_offset_distance;
  dVar18 = -auVar17._8_8_ * half_offset_distance;
  local_d8 = local_d8 + dVar15;
  dStack_d0 = dStack_d0 + dVar18;
  local_48.x = local_f8 - local_108;
  local_48.y = dStack_f0 - dStack_100;
  local_118 = (0.0 / dVar8) * half_offset_distance;
  dStack_110 = -(0.0 / dVar8) * half_offset_distance;
  local_e8 = start_vertex->z + local_118;
  local_128 = dVar9 + local_118;
  dStack_120 = start_vertex->z + dStack_110;
  uStack_e0 = 0;
  local_48.z = local_128 - local_e8;
  dVar8 = *param_4 * 0.5;
  dVar12 = *last_local_layer_height * 0.5;
  auVar3._8_8_ = (dStack_120 - local_e8) * (dStack_120 - local_e8) +
                 (local_d8 - local_108) * (local_d8 - local_108) +
                 (dStack_d0 - dStack_100) * (dStack_d0 - dStack_100);
  auVar3._0_8_ = local_48.z * local_48.z + local_48.x * local_48.x + local_48.y * local_48.y;
  auVar17 = sqrtpd(ZEXT816(0x3fe0000000000000),auVar3);
  local_148 = vector3::GetZAngle(&local_48);
  local_68.z = (start_vertex->z + end_vertex->z) * 0.5;
  local_68.x = (start_vertex->x + end_vertex->x) * 0.5;
  local_68.y = (start_vertex->y + end_vertex->y) * 0.5;
  local_1a8 = auVar17._0_8_;
  dStack_1a0 = auVar17._8_8_;
  local_88.x = local_1a8 * 0.5;
  dVar13 = dStack_1a0 * 0.5;
  local_88.z = 0.0;
  dVar1 = *param_4;
  local_a8.z = -dVar1;
  local_a8.x = local_1a8 * -0.5;
  local_a8.y = dStack_1a0 * -0.5;
  if (((((*last_local_layer_height == 0.0) && (!NAN(*last_local_layer_height))) && (dVar1 == 0.0))
      && (!NAN(dVar1))) ||
     ((dVar1 = start_vertex->x - end_vertex->x, dVar2 = start_vertex->y - end_vertex->y,
      dVar14 = start_vertex->z - end_vertex->z,
      dVar1 = SQRT(dVar14 * dVar14 + dVar1 * dVar1 + dVar2 * dVar2), dVar1 == 0.0 && (!NAN(dVar1))))
     ) {
    bVar7 = false;
  }
  else {
    dVar9 = dVar9 + dStack_110;
    local_140 = last_local_layer_height;
    local_138 = param_4;
    local_88.y = dVar13;
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(out + 0x10),"intersection{\n",0xe);
      operator<<((ostream *)(out + 0x10),cutting_plane);
    }
    os = (ostream *)(out + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(os,"union{\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(os,"cone\n{ ",7);
    local_168.z = local_e8 - dVar12;
    local_168.x = local_108;
    local_168.y = dStack_100;
    operator<<(os,&local_168);
    std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
    poVar6 = std::ostream::_M_insert<double>(dVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    local_c8.z = local_128 - dVar8;
    local_c8.x = local_f8;
    local_c8.y = dStack_f0;
    operator<<(poVar6,&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"cone\n{ ",7);
    local_168.z = dStack_120 - dVar12;
    local_168.x = local_d8;
    local_168.y = dStack_d0;
    operator<<(os,&local_168);
    std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
    poVar6 = std::ostream::_M_insert<double>(dVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    local_c8.z = dVar9 - dVar8;
    local_c8.x = dVar11 + dVar15;
    local_c8.y = dVar10 + dVar18;
    operator<<(poVar6,&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"box\n{",5);
    operator<<(os,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
    operator<<(os,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\nrotate z*",10);
    poVar6 = std::ostream::_M_insert<double>(local_148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\ntranslate ",0xb);
    operator<<(poVar6,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
    pdVar4 = local_140;
    if ((*local_140 != 0.0) || (NAN(*local_140))) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"torus\n{",7);
      poVar6 = std::ostream::_M_insert<double>(dVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<double>(dVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nrotate x*90 \ntranslate ",0x18);
      local_168.z = start_vertex->z - dVar12;
      local_168.x = start_vertex->x;
      local_168.y = start_vertex->y;
      operator<<(poVar6,&local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
      dVar10 = start_vertex->x - start_vertex->x;
      dVar9 = start_vertex->y - start_vertex->y;
      dVar11 = start_vertex->z - (start_vertex->z - *pdVar4);
      dVar11 = SQRT(dVar11 * dVar11 + dVar10 * dVar10 + dVar9 * dVar9);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"cylinder\n{",10);
        local_168.z = start_vertex->z - *pdVar4;
        local_168.x = start_vertex->x;
        local_168.y = start_vertex->y;
        operator<<(os,&local_168);
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        operator<<(os,start_vertex);
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        poVar6 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
      }
    }
    pdVar4 = local_138;
    if ((*local_138 != 0.0) || (NAN(*local_138))) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"torus\n{",7);
      poVar6 = std::ostream::_M_insert<double>(dVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<double>(dVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nrotate x*90 \ntranslate ",0x18);
      local_168.z = end_vertex->z - dVar8;
      local_168.x = end_vertex->x;
      local_168.y = end_vertex->y;
      operator<<(poVar6,&local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
      dVar10 = end_vertex->x - end_vertex->x;
      dVar11 = end_vertex->y - end_vertex->y;
      dVar9 = end_vertex->z - (end_vertex->z - *pdVar4);
      dVar11 = SQRT(dVar9 * dVar9 + dVar10 * dVar10 + dVar11 * dVar11);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"cylinder\n{",10);
        local_168.z = end_vertex->z - *pdVar4;
        local_168.x = end_vertex->x;
        local_168.y = end_vertex->y;
        operator<<(os,&local_168);
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        operator<<(os,end_vertex);
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        poVar6 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n}\n",3);
      }
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"texture{ GcodeTexture }\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool GenerateFineGeometryCuttingPlane(vector3 &start_vertex, vector3 &end_vertex, double half_offset_distance, const double &local_layer_height, double last_half_offset_distance, const double &last_local_layer_height, const double &cylinder_height, bool has_cutting_plane, CuttingPlane &cutting_plane, fstream &out)
{
  bool need_to_cut = false;
  double distance_tolerance = NOZZLE_DIAMETER;

  bool not_null = false;

  if (!has_cutting_plane)
  {
    need_to_cut = false;
  }
  else
  {
    if (cutting_plane.DeviationFromPlane(start_vertex, end_vertex, distance_tolerance))
    {
      if (cutting_plane.OnPlanePositive(start_vertex, end_vertex))
      {
        need_to_cut = false;
      }
      else
      {
        return not_null;
      }
    }
    else
    {
      need_to_cut = true;
    }
  }

  vector3 left_start, left_end, right_start, right_end;
  vector3 link_vertex = end_vertex - start_vertex;
  vector3 offset_vertex(link_vertex.y, -link_vertex.x, 0);
  offset_vertex.Uniform();

  left_start = start_vertex + offset_vertex * half_offset_distance;
  left_end = end_vertex + offset_vertex * half_offset_distance;

  offset_vertex.Reverse();
  right_start = start_vertex + offset_vertex * half_offset_distance;
  right_end = end_vertex + offset_vertex * half_offset_distance;

  //vector3 local_x_axis, local_y_axis;
  //local_x_axis = left_end - left_start;
  //local_y_axis = right_start - left_start;
  //local_x_axis.Uniform();
  //local_y_axis.Uniform();
  //vector3 local_origin = left_start.MoveDownRadius(local_layer_height);
  //vector3 corner_link = right_end - local_origin;
  //double local_x_coordinate = corner_link * local_x_axis;
  //double local_y_coordinate = corner_link * local_y_axis;
  double cone_bottom_radius = local_layer_height / 2;
  double cone_top_radius = last_local_layer_height / 2;
  //vector3 box_corner_vertex(local_x_coordinate, local_y_coordinate, local_layer_height);


  double x_length = (left_end - left_start).Length();
  double y_length = (right_start - left_start).Length();
  vector3 rotate_vector = left_end - left_start;
  //   double x_angle = rotate_vector.GetXAngle();
  //   double y_angle = rotate_vector.GetYAngle();
  double z_angle = rotate_vector.GetZAngle();
  vector3 target_center_point = (start_vertex + end_vertex) * 0.5;
  vector3 initial_box_right_corner(x_length / 2, y_length / 2, 0);
  vector3 initial_box_left_corner(-x_length / 2, -y_length / 2, -local_layer_height);

  if (last_local_layer_height == 0 && local_layer_height == 0)
  {
    return not_null;
  }

  if ((start_vertex - end_vertex).Length() == 0)
  {
    return not_null;
  }

  not_null = true;

  if (need_to_cut)
  {
    out << "intersection{\n";
    out << cutting_plane;
  }

  out << "union{\n";

  out << "cone\n\
{ " << left_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << left_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "cone\n\
{ " << right_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << right_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "box\n\
{" << initial_box_left_corner << "," << initial_box_right_corner << "\n\
rotate z*" << z_angle << "\n\
translate " << target_center_point << "\n\
}\n";

  if (last_local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_top_radius << "\n\
rotate x*90 \n\
translate " << (start_vertex).MoveDownRadius(cone_top_radius) << "\n\
}\n";

    vector3 temp = (start_vertex).MoveDownRadius(last_local_layer_height);
    if ((start_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (start_vertex).MoveDownRadius(last_local_layer_height) << ", " << (start_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_bottom_radius << "\n\
rotate x*90 \n\
translate " << (end_vertex).MoveDownRadius(cone_bottom_radius) << "\n\
}\n";

    vector3 temp = (end_vertex).MoveDownRadius(local_layer_height);
    if ((end_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (end_vertex).MoveDownRadius(local_layer_height) << ", " << (end_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (need_to_cut)
  {
    out << "}\n";
  }

  out << "texture{ GcodeTexture }\n";
  out << "}\n";

  return not_null;
}